

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

bool r_exec::match(IPGMContext *input,IPGMContext *pattern,IPGMContext *productions,
                  vector<unsigned_short,_std::allocator<unsigned_short>_> *production_indices)

{
  iterator __position;
  bool bVar1;
  short sVar2;
  int iVar3;
  uint16_t index;
  uint16_t production_index;
  uint16_t unused_index;
  IPGMContext c;
  IPGMContext prod;
  uint16_t local_ce;
  unsigned_short local_cc;
  uint16_t local_ca;
  IPGMContext *local_c8;
  IPGMContext local_c0;
  IPGMContext local_90;
  IPGMContext local_60;
  
  local_90.super__Context.overlay = (Overlay *)0x0;
  local_90.super__Context.code = (Atom *)0x0;
  local_90.super__Context.index = 0;
  local_90.super__Context.data = UNDEFINED;
  local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
  local_90.object = (Code *)0x0;
  local_90.view = (View *)0x0;
  local_c8 = productions;
  sVar2 = r_code::Atom::asOpcode();
  if (sVar2 == Opcodes::Ptn) {
    IPGMContext::getChild(&local_60,pattern,1);
    IPGMContext::operator*(&local_c0,&local_60);
    local_90.object = local_c0.object;
    local_90.view = local_c0.view;
    local_90.super__Context.code = local_c0.super__Context.code;
    local_90.super__Context.index = local_c0.super__Context.index;
    local_90.super__Context.data = local_c0.super__Context.data;
    bVar1 = IPGMContext::match(&local_90,input);
    if (bVar1) {
      local_ce = Overlay::get_last_patch_index((pattern->super__Context).overlay);
      bVar1 = match(input,pattern);
      if (bVar1) {
LAB_0015df95:
        iVar3 = (*(local_c8->super__Context)._vptr__Context[6])();
        if ((ushort)iVar3 != 0) {
          index = 1;
          do {
            IPGMContext::getChild(&local_60,local_c8,index);
            if ((local_60.super__Context.data | VWS) != VALUE_ARRAY) {
              IPGMContext::operator*(&local_c0,&local_60);
              IPGMContext::evaluate_no_dereference(&local_c0,&local_ca);
            }
            IPGMContext::copy_to_value_array(&local_60,&local_cc);
            __position._M_current =
                 (production_indices->
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (production_indices->
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>
                        ((vector<unsigned_short,std::allocator<unsigned_short>> *)production_indices
                         ,__position,&local_cc);
            }
            else {
              *__position._M_current = local_cc;
              (production_indices->
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            index = index + 1;
          } while (index <= (ushort)iVar3);
        }
        Overlay::unpatch_code((pattern->super__Context).overlay,local_ce);
        return true;
      }
    }
  }
  else {
    sVar2 = r_code::Atom::asOpcode();
    if (sVar2 == Opcodes::AntiPtn) {
      IPGMContext::getChild(&local_60,pattern,1);
      IPGMContext::operator*(&local_c0,&local_60);
      local_90.object = local_c0.object;
      local_90.view = local_c0.view;
      local_90.super__Context.code = local_c0.super__Context.code;
      local_90.super__Context.index = local_c0.super__Context.index;
      local_90.super__Context.data = local_c0.super__Context.data;
      bVar1 = IPGMContext::match(&local_90,input);
      if (!bVar1) {
        local_ce = Overlay::get_last_patch_index((pattern->super__Context).overlay);
        bVar1 = match(input,pattern);
        if (!bVar1) goto LAB_0015df95;
      }
    }
  }
  return false;
}

Assistant:

bool match(const IPGMContext &input, const IPGMContext &pattern, const IPGMContext &productions, std::vector<uint16_t> &production_indices)
{
    IPGMContext skeleton = IPGMContext();
    uint16_t last_patch_index;

    if (pattern[0].asOpcode() == Opcodes::Ptn) {
        skeleton = *pattern.getChild(1);

        if (!skeleton.match(input)) {
            return false;
        }

        last_patch_index = pattern.get_last_patch_index();

        if (!match(input, pattern)) {
            return false;
        }

        goto build_productions;
    }

    if (pattern[0].asOpcode() == Opcodes::AntiPtn) {
        skeleton = *pattern.getChild(1);

        if (skeleton.match(input)) {
            return false;
        }

        last_patch_index = pattern.get_last_patch_index();

        if (match(input, pattern)) {
            return false;
        }

        goto build_productions;
    }

    return false;
build_productions:
    // compute all productions for this input.
    uint16_t production_count = productions.getChildrenCount();
    uint16_t unused_index;
    uint16_t production_index;

    for (uint16_t i = 1; i <= production_count; ++i) {
        IPGMContext prod = productions.getChild(i);
        //prod.trace();
        prod.evaluate(unused_index);
        prod.copy_to_value_array(production_index);
        production_indices.push_back(production_index);
    }

    pattern.unpatch_code(last_patch_index);
    return true;
}